

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.h
# Opt level: O0

void __thiscall
cmTargetCompileFeaturesCommand::~cmTargetCompileFeaturesCommand
          (cmTargetCompileFeaturesCommand *this)

{
  cmTargetCompileFeaturesCommand *this_local;
  
  ~cmTargetCompileFeaturesCommand(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmTargetCompileFeaturesCommand; }